

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calibrateGyro.cpp
# Opt level: O2

bool __thiscall CalibrateGyro::CalculateM(CalibrateGyro *this)

{
  bool bVar1;
  CalibrateGyro *__x;
  CalibrateGyro *pCVar2;
  CalibrateGyro *pCVar3;
  ulong uVar4;
  int *num_00;
  Vector3d *RotationAngle_00;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 local_168 [48];
  Vector3d RotationAngle [6];
  undefined1 local_a0 [24];
  int num [6];
  
  bVar1 = CalculateBias(this);
  if (bVar1) {
    num_00 = num;
    RotationAngle_00 = RotationAngle;
    __x = this;
    for (uVar4 = 0; uVar4 != 6; uVar4 = uVar4 + 1) {
      if (uVar4 < 2) {
        pCVar2 = (CalibrateGyro *)local_a0;
        std::
        vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)local_a0,__x->Gyro_Kinematic);
        CalculateRotation(pCVar2,(VecVector3d *)local_a0,0,RotationAngle_00,num_00);
        pCVar2 = (CalibrateGyro *)local_a0;
      }
      else if (uVar4 < 4) {
        pCVar3 = (CalibrateGyro *)(local_168 + 0x18);
        std::
        vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)pCVar3,__x->Gyro_Kinematic);
        pCVar2 = (CalibrateGyro *)(local_168 + 0x18);
        CalculateRotation(pCVar3,(VecVector3d *)pCVar2,1,RotationAngle_00,num_00);
      }
      else {
        pCVar3 = (CalibrateGyro *)local_168;
        std::
        vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)pCVar3,__x->Gyro_Kinematic);
        pCVar2 = (CalibrateGyro *)local_168;
        CalculateRotation(pCVar3,(VecVector3d *)pCVar2,2,RotationAngle_00,num_00);
      }
      free(pCVar2->Gyro_Kinematic[0].
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start);
      num_00 = num_00 + 1;
      RotationAngle_00 = RotationAngle_00 + 1;
      __x = (CalibrateGyro *)
            (&__x->Gyro_Kinematic[0].
              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            + 1);
    }
    (this->M).super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[8]
         = ((RotationAngle[4].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
             .m_data.array[2] -
            RotationAngle[5].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
            m_data.array[2]) / 6.283185307179586) * 0.5;
    auVar9 = _DAT_0012b4c0;
    auVar5._0_8_ = RotationAngle[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[0] -
                   RotationAngle[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[0];
    auVar5._8_8_ = RotationAngle[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[1] -
                   RotationAngle[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[1];
    auVar5 = divpd(auVar5,_DAT_0012b4c0);
    (this->M).super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[0]
         = auVar5._0_8_ * 0.5;
    (this->M).super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[1]
         = auVar5._8_8_ * 0.5;
    auVar6._0_8_ = RotationAngle[4].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[0] -
                   RotationAngle[5].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[0];
    auVar6._8_8_ = RotationAngle[4].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[1] -
                   RotationAngle[5].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[1];
    auVar5 = divpd(auVar6,auVar9);
    (this->M).super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[6]
         = auVar5._0_8_ * 0.5;
    (this->M).super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[7]
         = auVar5._8_8_ * 0.5;
    auVar7._0_8_ = RotationAngle[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[2] -
                   RotationAngle[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[2];
    auVar7._8_8_ = RotationAngle[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[0] -
                   RotationAngle[3].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[0];
    auVar5 = divpd(auVar7,auVar9);
    (this->M).super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[2]
         = auVar5._0_8_ * 0.5;
    (this->M).super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[3]
         = auVar5._8_8_ * 0.5;
    auVar8._0_8_ = RotationAngle[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[1] -
                   RotationAngle[3].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[1];
    auVar8._8_8_ = RotationAngle[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[2] -
                   RotationAngle[3].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[2];
    auVar9 = divpd(auVar8,auVar9);
    (this->M).super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[4]
         = auVar9._0_8_ * 0.5;
    (this->M).super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[5]
         = auVar9._8_8_ * 0.5;
    Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,__1,__1,_false> *)
               &stack0xffffffffffffff98,&this->M,0,3,3,1);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,_1,_1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,__1,__1,_false> *)
               &stack0xffffffffffffff98,&this->Bias);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool CalibrateGyro::CalculateM()
{
    bool flag = CalculateBias();
    if(!flag)
        return false;
    Vector3d RotationAngle[6];
    int num[6];
    try
    {
        for(int i = 0; i < 6; ++i)
        {
            if(i <= 1)
                this->CalculateRotation(this->Gyro_Kinematic[i], 0, RotationAngle[i], num[i]);
            else if(i >= 2 && i < 4)
                this->CalculateRotation(this->Gyro_Kinematic[i], 1, RotationAngle[i], num[i]);
            else if(i >= 4 && i < 6)
                this->CalculateRotation(this->Gyro_Kinematic[i], 2, RotationAngle[i], num[i]);
        }
    }
    catch(const std::exception& e)
    {
        std::cout << e.what() << '\n';
        return false;
    }
    
    double PI_2 = PI * 2;
    M(0, 0) = (RotationAngle[0][0] - RotationAngle[1][0]) / PI_2 / 2;   // X axis scale factor
    M(1, 1) = (RotationAngle[2][1] - RotationAngle[3][1]) / PI_2 / 2;   // Y axis scale factor
    M(2, 2) = (RotationAngle[4][2] - RotationAngle[5][2]) / PI_2 / 2;   // Z axis scale factor

    M(0, 1) = (RotationAngle[2][0] - RotationAngle[3][0]) / PI_2 / 2;   // yx
    M(0, 2) = (RotationAngle[4][0] - RotationAngle[5][0]) / PI_2 / 2;   // zx

    M(1, 0) = (RotationAngle[0][1] - RotationAngle[1][1]) / PI_2 / 2;   // xy
    M(1, 2) = (RotationAngle[4][1] - RotationAngle[5][1]) / PI_2 / 2;   // zy

    M(2, 0) = (RotationAngle[0][2] - RotationAngle[1][2]) / PI_2 / 2;   // xz
    M(2, 1) = (RotationAngle[2][2] - RotationAngle[3][2]) / PI_2 / 2;   // yz

    // M.block(0, 0, 3, 3) += Matrix3d::Identity();
    M.block(0, 3, 3, 1) = this->Bias;
    return true;
}